

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mercuryparser.cpp
# Opt level: O0

void __thiscall MercuryJson::JSON::_error(JSON *this,char *expected,char encountered,size_t index)

{
  ostream *poVar1;
  ulong in_RCX;
  char in_DL;
  char *in_RSI;
  size_t in_stack_00000040;
  char *in_stack_00000048;
  string *in_stack_00000050;
  size_t len;
  char _encounter [3];
  stringstream stream;
  size_t local_1b8;
  char local_1ab [3];
  stringstream local_1a8 [16];
  ostream local_198 [376];
  ulong local_20;
  char local_11;
  char *local_10;
  
  local_20 = in_RCX;
  local_11 = in_DL;
  local_10 = in_RSI;
  std::__cxx11::stringstream::stringstream((stringstream *)(local_1ab + 3));
  local_1b8 = 0;
  __error_maybe_escape(local_1ab,&local_1b8,local_11);
  local_1ab[local_1b8] = '\0';
  poVar1 = std::operator<<(local_198,"expected ");
  poVar1 = std::operator<<(poVar1,local_10);
  poVar1 = std::operator<<(poVar1," at index ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_20);
  poVar1 = std::operator<<(poVar1,", but encountered \'");
  poVar1 = std::operator<<(poVar1,local_1ab);
  std::operator<<(poVar1,"\'");
  std::__cxx11::stringstream::str();
  __error(in_stack_00000050,in_stack_00000048,in_stack_00000040);
}

Assistant:

[[noreturn]] void JSON::_error(const char *expected, char encountered, size_t index) {
        std::stringstream stream;
        char _encounter[3];
        size_t len = 0;
        __error_maybe_escape(_encounter, &len, encountered);
        _encounter[len] = 0;
        stream << "expected " << expected << " at index " << index << ", but encountered '" << _encounter << "'";
        MercuryJson::__error(stream.str(), input, index);
    }